

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zmyblas2.c
# Opt level: O0

void zmatvec(int ldm,int nrow,int ncol,doublecomplex *M,doublecomplex *vec,doublecomplex *Mxvec)

{
  double *pdVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double *pdVar12;
  int iVar13;
  double ci_4;
  double cr_4;
  double ci_3;
  double cr_3;
  double ci_2;
  double cr_2;
  double ci_1;
  double cr_1;
  double ci;
  double cr;
  int k;
  int firstcol;
  doublecomplex *Mki3;
  doublecomplex *Mki2;
  doublecomplex *Mki1;
  doublecomplex *Mki0;
  doublecomplex temp;
  doublecomplex *M0;
  doublecomplex vi3;
  doublecomplex vi2;
  doublecomplex vi1;
  doublecomplex vi0;
  doublecomplex *Mxvec_local;
  doublecomplex *vec_local;
  doublecomplex *M_local;
  int ncol_local;
  int nrow_local;
  int ldm_local;
  
  cr._4_4_ = 0;
  temp.i = (double)M;
  while (cr._4_4_ < ncol + -3) {
    Mki1 = (doublecomplex *)temp.i;
    Mki2 = (doublecomplex *)((long)temp.i + (long)ldm * 0x10);
    Mki3 = Mki2 + ldm;
    _k = Mki3 + ldm;
    dVar4 = vec[cr._4_4_].r;
    dVar5 = vec[cr._4_4_].i;
    dVar6 = vec[cr._4_4_ + 1].r;
    dVar7 = vec[cr._4_4_ + 1].i;
    iVar13 = cr._4_4_ + 3;
    dVar8 = vec[cr._4_4_ + 2].r;
    dVar9 = vec[cr._4_4_ + 2].i;
    cr._4_4_ = cr._4_4_ + 4;
    dVar10 = vec[iVar13].r;
    dVar11 = vec[iVar13].i;
    for (cr._0_4_ = 0; cr._0_4_ < nrow; cr._0_4_ = cr._0_4_ + 1) {
      pdVar12 = &Mki1->r;
      pdVar1 = &Mki1->i;
      dVar2 = Mki1->r;
      dVar3 = Mki1->i;
      Mki1 = Mki1 + 1;
      Mxvec[cr._0_4_].r = Mxvec[cr._0_4_].r + dVar4 * *pdVar12 + -(dVar5 * *pdVar1);
      Mxvec[cr._0_4_].i = Mxvec[cr._0_4_].i + dVar5 * dVar2 + dVar4 * dVar3;
      pdVar12 = &Mki2->r;
      pdVar1 = &Mki2->i;
      dVar2 = Mki2->r;
      dVar3 = Mki2->i;
      Mki2 = Mki2 + 1;
      Mxvec[cr._0_4_].r = Mxvec[cr._0_4_].r + dVar6 * *pdVar12 + -(dVar7 * *pdVar1);
      Mxvec[cr._0_4_].i = Mxvec[cr._0_4_].i + dVar7 * dVar2 + dVar6 * dVar3;
      pdVar12 = &Mki3->r;
      pdVar1 = &Mki3->i;
      dVar2 = Mki3->r;
      dVar3 = Mki3->i;
      Mki3 = Mki3 + 1;
      Mxvec[cr._0_4_].r = Mxvec[cr._0_4_].r + dVar8 * *pdVar12 + -(dVar9 * *pdVar1);
      Mxvec[cr._0_4_].i = Mxvec[cr._0_4_].i + dVar9 * dVar2 + dVar8 * dVar3;
      pdVar12 = &_k->r;
      pdVar1 = &_k->i;
      dVar2 = _k->r;
      dVar3 = _k->i;
      _k = _k + 1;
      Mxvec[cr._0_4_].r = Mxvec[cr._0_4_].r + dVar10 * *pdVar12 + -(dVar11 * *pdVar1);
      Mxvec[cr._0_4_].i = Mxvec[cr._0_4_].i + dVar11 * dVar2 + dVar10 * dVar3;
    }
    temp.i = (double)((long)temp.i + (long)(ldm << 2) * 0x10);
  }
  while (cr._4_4_ < ncol) {
    Mki1 = (doublecomplex *)temp.i;
    dVar4 = vec[cr._4_4_].r;
    dVar5 = vec[cr._4_4_].i;
    for (cr._0_4_ = 0; cr._0_4_ < nrow; cr._0_4_ = cr._0_4_ + 1) {
      pdVar12 = &Mki1->r;
      pdVar1 = &Mki1->i;
      dVar6 = Mki1->r;
      dVar7 = Mki1->i;
      Mki1 = Mki1 + 1;
      Mxvec[cr._0_4_].r = Mxvec[cr._0_4_].r + dVar4 * *pdVar12 + -(dVar5 * *pdVar1);
      Mxvec[cr._0_4_].i = Mxvec[cr._0_4_].i + dVar5 * dVar6 + dVar4 * dVar7;
    }
    temp.i = (double)((long)temp.i + (long)ldm * 0x10);
    cr._4_4_ = cr._4_4_ + 1;
  }
  return;
}

Assistant:

void zmatvec (int ldm, int nrow, int ncol, doublecomplex *M, doublecomplex *vec, doublecomplex *Mxvec)
{
    doublecomplex vi0, vi1, vi2, vi3;
    doublecomplex *M0, temp;
    doublecomplex *Mki0, *Mki1, *Mki2, *Mki3;
    register int firstcol = 0;
    int k;

    M0 = &M[0];

    while ( firstcol < ncol - 3 ) {	/* Do 4 columns */
	Mki0 = M0;
	Mki1 = Mki0 + ldm;
	Mki2 = Mki1 + ldm;
	Mki3 = Mki2 + ldm;

	vi0 = vec[firstcol++];
	vi1 = vec[firstcol++];
	vi2 = vec[firstcol++];
	vi3 = vec[firstcol++];	
	for (k = 0; k < nrow; k++) {
	    zz_mult(&temp, &vi0, Mki0); Mki0++;
	    z_add(&Mxvec[k], &Mxvec[k], &temp);
	    zz_mult(&temp, &vi1, Mki1); Mki1++;
	    z_add(&Mxvec[k], &Mxvec[k], &temp);
	    zz_mult(&temp, &vi2, Mki2); Mki2++;
	    z_add(&Mxvec[k], &Mxvec[k], &temp);
	    zz_mult(&temp, &vi3, Mki3); Mki3++;
	    z_add(&Mxvec[k], &Mxvec[k], &temp);
	}

	M0 += 4 * ldm;
    }

    while ( firstcol < ncol ) {		/* Do 1 column */
 	Mki0 = M0;
	vi0 = vec[firstcol++];
	for (k = 0; k < nrow; k++) {
	    zz_mult(&temp, &vi0, Mki0); Mki0++;
	    z_add(&Mxvec[k], &Mxvec[k], &temp);
	}
	M0 += ldm;
    }
	
}